

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectExpression.cpp
# Opt level: O2

void __thiscall
ObjectExpression::putExpression
          (ObjectExpression *this,Identifier *ident,Scope scope,ptr<Expression> *expression,
          bool constant)

{
  __shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2> *this_00;
  Symbol symbol;
  Identifier IStack_78;
  Symbol local_58;
  
  std::__cxx11::string::string((string *)&IStack_78,(string *)ident);
  Symbol::Symbol(&local_58,&IStack_78,constant,scope);
  std::__cxx11::string::~string((string *)&IStack_78);
  this_00 = &std::__detail::
             _Map_base<Symbol,_std::pair<const_Symbol,_std::shared_ptr<Expression>_>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Expression>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_SymbolHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<Symbol,_std::pair<const_Symbol,_std::shared_ptr<Expression>_>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Expression>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_SymbolHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->expressionMap,&local_58)->
             super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>;
  std::__shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>::operator=
            (this_00,&expression->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>);
  Symbol::~Symbol(&local_58);
  return;
}

Assistant:

void ObjectExpression::putExpression(const Identifier &ident, Scope scope, ptr<Expression> expression, bool constant) {
    Symbol symbol(ident, constant, scope);
    expressionMap[symbol] = std::move(expression);
}